

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_event.hpp
# Opt level: O2

void __thiscall
asio::detail::posix_event::wait<asio::detail::scoped_lock<asio::detail::posix_mutex>>
          (posix_event *this,scoped_lock<asio::detail::posix_mutex> *lock)

{
  ulong uVar1;
  
  if (lock->locked_ == true) {
    uVar1 = this->state_;
    while ((uVar1 & 1) == 0) {
      this->state_ = uVar1 + 2;
      pthread_cond_wait((pthread_cond_t *)this,(pthread_mutex_t *)lock->mutex_);
      uVar1 = this->state_ - 2;
      this->state_ = uVar1;
    }
    return;
  }
  __assert_fail("lock.locked()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/efairbanks[P]TidaLink/link/cmake_include/../modules/asio-standalone/asio/include/asio/detail/posix_event.hpp"
                ,0x65,
                "void asio::detail::posix_event::wait(Lock &) [Lock = asio::detail::scoped_lock<asio::detail::posix_mutex>]"
               );
}

Assistant:

void wait(Lock& lock)
  {
    ASIO_ASSERT(lock.locked());
    while ((state_ & 1) == 0)
    {
      state_ += 2;
      ::pthread_cond_wait(&cond_, &lock.mutex().mutex_); // Ignore EINVAL.
      state_ -= 2;
    }
  }